

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel.cc
# Opt level: O2

char * MULTILABEL::bufread_label(labels *ld,char *c,io_buf *cache)

{
  size_t sVar1;
  ostream *poVar2;
  long lVar3;
  bool bVar4;
  uint32_t temp;
  uint *local_30;
  uint local_24;
  
  lVar3 = *(long *)c;
  v_array<unsigned_int>::clear(&ld->label_v);
  local_30 = (uint *)(c + 8);
  sVar1 = io_buf::buf_read(cache,(char **)&local_30,(lVar3 << 0x22) >> 0x20);
  if (sVar1 < (ulong)(lVar3 * 4)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"error in demarshal of cost data");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
      local_24 = *local_30;
      local_30 = local_30 + 1;
      v_array<unsigned_int>::push_back(&ld->label_v,&local_24);
    }
  }
  return (char *)local_30;
}

Assistant:

char* bufread_label(labels* ld, char* c, io_buf& cache)
{
  size_t num = *(size_t*)c;
  ld->label_v.clear();
  c += sizeof(size_t);
  size_t total = sizeof(uint32_t) * num;
  if (cache.buf_read(c, (int)total) < total)
  {
    cout << "error in demarshal of cost data" << endl;
    return c;
  }
  for (size_t i = 0; i < num; i++)
  {
    uint32_t temp = *(uint32_t*)c;
    c += sizeof(uint32_t);
    ld->label_v.push_back(temp);
  }

  return c;
}